

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

double cJSON_SetNumberHelper(cJSON *object,double number)

{
  double number_local;
  cJSON *object_local;
  
  if (number < 2147483647.0) {
    if (-2147483648.0 < number) {
      object->valueint = (int)number;
    }
    else {
      object->valueint = -0x80000000;
    }
  }
  else {
    object->valueint = 0x7fffffff;
  }
  object->valuedouble = number;
  return number;
}

Assistant:

CJSON_PUBLIC(double) cJSON_SetNumberHelper(cJSON *object, double number)
{
    if (number >= INT_MAX)
    {
        object->valueint = INT_MAX;
    }
    else if (number <= (double)INT_MIN)
    {
        object->valueint = INT_MIN;
    }
    else
    {
        object->valueint = (int)number;
    }

    return object->valuedouble = number;
}